

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiprec_convolve_test_util.cc
# Opt level: O0

void __thiscall
libaom_test::AV1HighbdHiprecConvolve::AV1HighbdHiprecConvolveTest::RunCheckOutput
          (AV1HighbdHiprecConvolveTest *this,highbd_hiprec_convolve_func test_impl)

{
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  __tuple_element_t<0UL,_tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  *p_Var4;
  __tuple_element_t<1UL,_tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  *p_Var5;
  __tuple_element_t<2UL,_tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  *p_Var6;
  __tuple_element_t<3UL,_tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  *p_Var7;
  type puVar8;
  pointer puVar9;
  AssertHelper *this_00;
  Message *message;
  char *pcVar10;
  code *in_RSI;
  ulong uVar11;
  ulong uVar12;
  AssertionResult gtest_ar_3;
  int offset_c;
  int offset_r;
  int kernel_type;
  uint8_t *output2_ptr;
  uint8_t *output_ptr;
  uint8_t *input_ptr;
  InterpKernel vkernel;
  InterpKernel hkernel;
  AssertionResult gtest_ar_2;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> output2;
  AssertionResult gtest_ar_1;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> output;
  int output_n;
  AssertionResult gtest_ar;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> input;
  WienerConvolveParams conv_params;
  int j;
  int i;
  int bd;
  int num_iters;
  int out_h;
  int out_w;
  int h;
  int w;
  int in_stack_000104fc;
  int16_t *in_stack_00010500;
  ptrdiff_t in_stack_00010508;
  uint8_t *in_stack_00010510;
  ptrdiff_t in_stack_00010518;
  uint8_t *in_stack_00010520;
  int16_t *in_stack_00010540;
  int in_stack_00010548;
  int in_stack_00010550;
  int in_stack_00010558;
  WienerConvolveParams *in_stack_00010560;
  int in_stack_00010568;
  char (*in_stack_fffffffffffffda8) [25];
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  __tuple_element_t<0UL,_tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  __tuple_element_t<1UL,_tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  char *in_stack_fffffffffffffdc8;
  WienerConvolveParams *lhs_expression;
  undefined4 in_stack_fffffffffffffdd0;
  int iVar13;
  undefined4 in_stack_fffffffffffffdd4;
  undefined8 in_stack_fffffffffffffdd8;
  Type type;
  AssertHelper *in_stack_fffffffffffffde0;
  Message *in_stack_fffffffffffffe28;
  AssertHelper *in_stack_fffffffffffffe30;
  AssertionResult local_140;
  int local_12c;
  int local_128;
  int local_124;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  char local_108 [16];
  undefined1 local_f8 [40];
  undefined8 local_d0;
  AssertionResult local_c8 [2];
  undefined8 local_a0;
  AssertionResult local_98;
  int local_80;
  uint local_7c;
  undefined8 local_58;
  AssertionResult local_50;
  WienerConvolveParams local_38;
  int local_30;
  int local_2c;
  int local_28;
  __tuple_element_t<2UL,_tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  local_24;
  __tuple_element_t<1UL,_tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  local_20;
  __tuple_element_t<0UL,_tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  local_1c;
  undefined4 local_18;
  undefined4 local_14;
  code *local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_14 = 0x80;
  local_18 = 0x80;
  local_10 = in_RSI;
  testing::
  WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  ::GetParam();
  p_Var4 = std::
           get<0ul,int,int,int,int,void(*)(unsigned_char_const*,long,unsigned_char*,long,short_const*,int,short_const*,int,int,int,WienerConvolveParams_const*,int)>
                     ((tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                       *)0x465bda);
  local_1c = *p_Var4;
  testing::
  WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  ::GetParam();
  p_Var5 = std::
           get<1ul,int,int,int,int,void(*)(unsigned_char_const*,long,unsigned_char*,long,short_const*,int,short_const*,int,int,int,WienerConvolveParams_const*,int)>
                     ((tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                       *)0x465bf0);
  local_20 = *p_Var5;
  testing::
  WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  ::GetParam();
  p_Var6 = std::
           get<2ul,int,int,int,int,void(*)(unsigned_char_const*,long,unsigned_char*,long,short_const*,int,short_const*,int,int,int,WienerConvolveParams_const*,int)>
                     ((tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                       *)0x465c06);
  local_24 = *p_Var6;
  testing::
  WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
  ::GetParam();
  p_Var7 = std::
           get<3ul,int,int,int,int,void(*)(unsigned_char_const*,long,unsigned_char*,long,short_const*,int,short_const*,int,int,int,WienerConvolveParams_const*,int)>
                     ((tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                       *)0x465c1c);
  local_28 = *p_Var7;
  local_38 = get_conv_params_wiener(local_28);
  operator_new__(0x8000,(nothrow_t *)&std::nothrow);
  std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>::
  unique_ptr<unsigned_short*,std::default_delete<unsigned_short[]>,void,bool>
            ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             (unsigned_short *)in_stack_fffffffffffffda8);
  local_58 = 0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
            (in_stack_fffffffffffffdc8,
             (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             (void **)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffde0);
    testing::AssertionResult::failure_message((AssertionResult *)0x465d11);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffde0,type,
               (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    testing::Message::~Message((Message *)0x465d74);
  }
  local_7c = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x465de2);
  if (local_7c == 0) {
    local_80 = (local_1c + 0xfU & 0xfffffff0) * local_20;
    uVar11 = (ulong)local_80;
    uVar12 = uVar11 * 2;
    if (CARRY8(uVar11,uVar11)) {
      uVar12 = 0xffffffffffffffff;
    }
    operator_new__(uVar12,(nothrow_t *)&std::nothrow);
    std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>::
    unique_ptr<unsigned_short*,std::default_delete<unsigned_short[]>,void,bool>
              ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (unsigned_short *)in_stack_fffffffffffffda8);
    local_a0 = 0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
              (in_stack_fffffffffffffdc8,
               (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (void **)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_98);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffde0);
      testing::AssertionResult::failure_message((AssertionResult *)0x465f0c);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffde0,type,
                 (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      testing::Message::~Message((Message *)0x465f6f);
    }
    local_7c = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x465fdd);
    if (local_7c == 0) {
      uVar11 = (ulong)local_80;
      uVar12 = uVar11 * 2;
      if (CARRY8(uVar11,uVar11)) {
        uVar12 = 0xffffffffffffffff;
      }
      operator_new__(uVar12,(nothrow_t *)&std::nothrow);
      std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>::
      unique_ptr<unsigned_short*,std::default_delete<unsigned_short[]>,void,bool>
                ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (unsigned_short *)in_stack_fffffffffffffda8);
      local_d0 = 0;
      testing::internal::
      CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
                (in_stack_fffffffffffffdc8,
                 (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (void **)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      iVar13 = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_c8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffde0);
        testing::AssertionResult::failure_message((AssertionResult *)0x4660e9);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffde0,type,
                   (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),iVar13,
                   (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        testing::Message::~Message((Message *)0x46614c);
      }
      local_7c = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x4661ba);
      if (local_7c == 0) {
        for (local_2c = 0; local_2c < 0x80; local_2c = local_2c + 1) {
          for (local_30 = 0; local_30 < 0x80; local_30 = local_30 + 1) {
            uVar3 = ACMRandom::Rand16((ACMRandom *)
                                      CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0))
            ;
            bVar1 = (byte)local_28 & 0x1f;
            puVar8 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::
                     operator[]((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>
                                 *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                                (size_t)in_stack_fffffffffffffda8);
            *puVar8 = uVar3 & (short)(1 << bVar1) - 1U;
          }
        }
        puVar9 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::get
                           ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
                            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        local_110 = (ulong)puVar9 >> 1;
        puVar9 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::get
                           ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
                            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        local_118 = (ulong)puVar9 >> 1;
        puVar9 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::get
                           ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
                            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        local_120 = (ulong)puVar9 >> 1;
        for (local_124 = 0; local_124 < 6; local_124 = local_124 + 1) {
          generate_kernels((ACMRandom *)
                           CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                           (int16_t *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                           (int16_t *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
          for (local_2c = 0; iVar13 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
              local_2c < local_24; local_2c = local_2c + 1) {
            local_128 = ACMRandom::PseudoUniform
                                  ((ACMRandom *)
                                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                                   iVar13);
            local_128 = local_128 + 3;
            local_12c = ACMRandom::PseudoUniform
                                  ((ACMRandom *)
                                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                                   iVar13);
            local_12c = local_12c + 3;
            av1_highbd_wiener_convolve_add_src_c
                      (in_stack_00010520,in_stack_00010518,in_stack_00010510,in_stack_00010508,
                       in_stack_00010500,in_stack_000104fc,in_stack_00010540,in_stack_00010548,
                       in_stack_00010550,in_stack_00010558,in_stack_00010560,in_stack_00010568);
            lhs_expression = &local_38;
            in_stack_fffffffffffffda8 = (char (*) [25])local_108;
            in_stack_fffffffffffffdb0 = 0x10;
            in_stack_fffffffffffffdb8 = local_1c;
            in_stack_fffffffffffffdc0 = local_20;
            iVar13 = local_28;
            (*local_10)(local_110 + (long)(local_128 << 7) + (long)local_12c,0x80,local_120,
                        (long)local_1c,local_f8,0x10);
            for (local_30 = 0; local_30 < local_1c * local_20; local_30 = local_30 + 1) {
              this_00 = (AssertHelper *)
                        std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::
                        operator[]((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>
                                    *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                                   (size_t)in_stack_fffffffffffffda8);
              message = (Message *)
                        std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::
                        operator[]((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>
                                    *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                                   (size_t)in_stack_fffffffffffffda8);
              testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
                        ((char *)lhs_expression,
                         (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                         (unsigned_short *)
                         CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         (unsigned_short *)
                         CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
              bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_140);
              if (!bVar2) {
                testing::Message::Message((Message *)in_stack_fffffffffffffde0);
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           in_stack_fffffffffffffda8);
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           (int *)in_stack_fffffffffffffda8);
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           (char (*) [5])in_stack_fffffffffffffda8);
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           (int *)in_stack_fffffffffffffda8);
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           (char (*) [3])in_stack_fffffffffffffda8);
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           (int *)in_stack_fffffffffffffda8);
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           (char (*) [16])in_stack_fffffffffffffda8);
                in_stack_fffffffffffffde0 =
                     (AssertHelper *)
                     testing::Message::operator<<
                               ((Message *)
                                CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                                (int *)in_stack_fffffffffffffda8);
                pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)0x4666df);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffde0,(Type)((ulong)pcVar10 >> 0x20),
                           (char *)CONCAT44(in_stack_fffffffffffffdd4,iVar13),
                           (int)((ulong)lhs_expression >> 0x20),
                           (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
                testing::internal::AssertHelper::operator=(this_00,message);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
                testing::Message::~Message((Message *)0x466739);
              }
              local_7c = (uint)!bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x4667a4);
              if (local_7c != 0) goto LAB_00466813;
            }
          }
        }
        local_7c = 0;
      }
LAB_00466813:
      std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr
                ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    }
    std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr
              ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  }
  std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr
            ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  return;
}

Assistant:

void AV1HighbdHiprecConvolveTest::RunCheckOutput(
    highbd_hiprec_convolve_func test_impl) {
  const int w = 128, h = 128;
  const int out_w = GET_PARAM(0), out_h = GET_PARAM(1);
  const int num_iters = GET_PARAM(2);
  const int bd = GET_PARAM(3);
  int i, j;
  const WienerConvolveParams conv_params = get_conv_params_wiener(bd);

  std::unique_ptr<uint16_t[]> input(new (std::nothrow) uint16_t[h * w]);
  ASSERT_NE(input, nullptr);

  // The AVX2 convolve functions always write rows with widths that are
  // multiples of 16. So to avoid a buffer overflow, we may need to pad
  // rows to a multiple of 16.
  int output_n = ALIGN_POWER_OF_TWO(out_w, 4) * out_h;
  std::unique_ptr<uint16_t[]> output(new (std::nothrow) uint16_t[output_n]);
  ASSERT_NE(output, nullptr);
  std::unique_ptr<uint16_t[]> output2(new (std::nothrow) uint16_t[output_n]);
  ASSERT_NE(output2, nullptr);

  // Generate random filter kernels
  DECLARE_ALIGNED(16, InterpKernel, hkernel);
  DECLARE_ALIGNED(16, InterpKernel, vkernel);

  for (i = 0; i < h; ++i)
    for (j = 0; j < w; ++j) input[i * w + j] = rnd_.Rand16() & ((1 << bd) - 1);

  uint8_t *input_ptr = CONVERT_TO_BYTEPTR(input.get());
  uint8_t *output_ptr = CONVERT_TO_BYTEPTR(output.get());
  uint8_t *output2_ptr = CONVERT_TO_BYTEPTR(output2.get());
  for (int kernel_type = 0; kernel_type < 6; kernel_type++) {
    generate_kernels(&rnd_, hkernel, vkernel, kernel_type);
    for (i = 0; i < num_iters; ++i) {
      // Choose random locations within the source block
      int offset_r = 3 + rnd_.PseudoUniform(h - out_h - 7);
      int offset_c = 3 + rnd_.PseudoUniform(w - out_w - 7);
      av1_highbd_wiener_convolve_add_src_c(
          input_ptr + offset_r * w + offset_c, w, output_ptr, out_w, hkernel,
          16, vkernel, 16, out_w, out_h, &conv_params, bd);
      test_impl(input_ptr + offset_r * w + offset_c, w, output2_ptr, out_w,
                hkernel, 16, vkernel, 16, out_w, out_h, &conv_params, bd);

      for (j = 0; j < out_w * out_h; ++j)
        ASSERT_EQ(output[j], output2[j])
            << "Pixel mismatch at index " << j << " = (" << (j % out_w) << ", "
            << (j / out_w) << ") on iteration " << i;
    }
  }
}